

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr.c
# Opt level: O3

void build_state_for(Grammar *g,State *s,Elem *e)

{
  Goto **ppGVar1;
  Item *pIVar2;
  Rule *pRVar3;
  Goto **ppGVar4;
  Production *pPVar5;
  undefined8 uVar6;
  uint uVar7;
  State *pSVar8;
  Elem **ppEVar9;
  Goto *elem;
  Elem *pEVar10;
  uint uVar11;
  VecGoto *v;
  ulong uVar12;
  
  uVar11 = (s->items).n;
  if (uVar11 != 0) {
    uVar12 = 0;
    pSVar8 = (State *)0x0;
    do {
      pIVar2 = (s->items).v[uVar12];
      if (((pIVar2->kind != ELEM_END) && (pIVar2->kind == e->kind)) &&
         ((pIVar2->e).nterm == (e->e).nterm)) {
        if (pSVar8 == (State *)0x0) {
          pSVar8 = (State *)calloc(1,0x1b0);
        }
        pRVar3 = pIVar2->rule;
        uVar11 = pIVar2->index + 1;
        if (uVar11 < (pRVar3->elems).n) {
          ppEVar9 = (pRVar3->elems).v + uVar11;
        }
        else {
          ppEVar9 = &pRVar3->end;
        }
        insert_item(pSVar8,*ppEVar9);
        uVar11 = (s->items).n;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < uVar11);
    if (pSVar8 != (State *)0x0) {
      pSVar8 = build_closure(g,pSVar8);
      elem = (Goto *)malloc(0x10);
      elem->state = pSVar8;
      pEVar10 = (Elem *)malloc(0x20);
      uVar7 = e->index;
      pRVar3 = e->rule;
      pPVar5 = (e->e).nterm;
      uVar6 = *(undefined8 *)((long)&e->e + 8);
      pEVar10->kind = e->kind;
      pEVar10->index = uVar7;
      pEVar10->rule = pRVar3;
      (pEVar10->e).nterm = pPVar5;
      *(undefined8 *)((long)&pEVar10->e + 8) = uVar6;
      elem->elem = pEVar10;
      ppGVar4 = (s->gotos).v;
      ppGVar1 = (s->gotos).e;
      if (ppGVar4 == (Goto **)0x0) {
        (s->gotos).v = ppGVar1;
        uVar11 = (s->gotos).n;
        (s->gotos).n = uVar11 + 1;
        (s->gotos).e[uVar11] = elem;
      }
      else {
        v = &s->gotos;
        uVar11 = v->n;
        if (ppGVar4 == ppGVar1) {
          if (2 < uVar11) goto LAB_00140092;
        }
        else if ((uVar11 & 7) == 0) {
LAB_00140092:
          vec_add_internal(v,elem);
          return;
        }
        v->n = uVar11 + 1;
        ppGVar4[uVar11] = elem;
      }
    }
  }
  return;
}

Assistant:

static void build_state_for(Grammar *g, State *s, Elem *e) {
  uint j;
  Item *i;
  State *ss = NULL;

  for (j = 0; j < s->items.n; j++) {
    i = s->items.v[j];
    if (i->kind != ELEM_END && i->kind == e->kind && i->e.term_or_nterm == e->e.term_or_nterm) {
      if (!ss) ss = new_state();
      insert_item(ss, next_elem(i));
    }
  }
  if (ss) add_goto(s, build_closure(g, ss), e);
}